

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::anon_unknown_129::dynamicCheckListDefaults<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  int iVar1;
  ReaderFor<bool> RVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  uint64_t uVar7;
  size_type sVar8;
  char *pcVar9;
  bool bVar10;
  ReaderFor<Text> RVar11;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  StringPtr name_60;
  initializer_list<capnp::Text::Reader> expected_02;
  initializer_list<capnp::Text::Reader> expected_03;
  initializer_list<capnp::Text::Reader> expected_04;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  StringPtr name_64;
  StringPtr name_65;
  StringPtr name_66;
  StringPtr name_67;
  StringPtr name_68;
  Fault f_7;
  ReaderFor<capnp::DynamicList> l;
  Fault f;
  ReaderFor<capnp::DynamicStruct> lists;
  undefined1 local_388 [72];
  Reader local_340;
  Reader local_2f8;
  ReaderFor<DynamicList> local_2a8;
  ArrayPtr<const_char> local_268;
  ReaderFor<DynamicStruct> local_258;
  uint64_t local_220;
  ReaderFor<DynamicStruct> local_218;
  Reader local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  name.content.size_ = 6;
  name.content.ptr = "lists";
  DynamicStruct::Reader::get((Reader *)local_388,(Reader *)&stack0x00000008,name);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_218,(Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  name_00.content.size_ = 6;
  name_00.content.ptr = "list0";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_00);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_62.content.size_ = 6;
    name_62.content.ptr = "list0";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_62);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x306,FAILED,"(2u) == (lists.get(\"list0\").template as<DynamicList>().size())",
               "2u, lists.get(\"list0\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_01.content.size_ = 6;
  name_01.content.ptr = "list1";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_01);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 4) {
    local_2a8.schema.elementType.baseType = INT32;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_63.content.size_ = 6;
    name_63.content.ptr = "list1";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_63);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x307,FAILED,"(4u) == (lists.get(\"list1\").template as<DynamicList>().size())",
               "4u, lists.get(\"list1\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_02.content.size_ = 6;
  name_02.content.ptr = "list8";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_02);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_64.content.size_ = 6;
    name_64.content.ptr = "list8";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_64);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x308,FAILED,"(2u) == (lists.get(\"list8\").template as<DynamicList>().size())",
               "2u, lists.get(\"list8\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "list16";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_03);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_65.content.size_ = 7;
    name_65.content.ptr = "list16";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_65);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x309,FAILED,"(2u) == (lists.get(\"list16\").template as<DynamicList>().size())",
               "2u, lists.get(\"list16\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_04.content.size_ = 7;
  name_04.content.ptr = "list32";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_04);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_66.content.size_ = 7;
    name_66.content.ptr = "list32";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_66);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30a,FAILED,"(2u) == (lists.get(\"list32\").template as<DynamicList>().size())",
               "2u, lists.get(\"list32\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_05.content.size_ = 7;
  name_05.content.ptr = "list64";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_05);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_67.content.size_ = 7;
    name_67.content.ptr = "list64";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_67);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30b,FAILED,"(2u) == (lists.get(\"list64\").template as<DynamicList>().size())",
               "2u, lists.get(\"list64\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_06.content.size_ = 6;
  name_06.content.ptr = "listP";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_06);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  uVar6 = local_340.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (uVar6 != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    name_68.content.size_ = 6;
    name_68.content.ptr = "listP";
    DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_68);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
    local_258.schema.super_Schema.raw._0_4_ = local_340.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x30c,FAILED,"(2u) == (lists.get(\"listP\").template as<DynamicList>().size())",
               "2u, lists.get(\"listP\").template as<DynamicList>().size()",(uint *)&local_2a8,
               (uint *)&local_258);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
  }
  name_07.content.size_ = 6;
  name_07.content.ptr = "list0";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_07);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_08.content.size_ = 2;
  name_08.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_08);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  name_09.content.size_ = 6;
  name_09.content.ptr = "list0";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_09);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_10.content.size_ = 2;
  name_10.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_10);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  name_11.content.size_ = 6;
  name_11.content.ptr = "list1";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_11);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_12.content.size_ = 2;
  name_12.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_12);
  RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if (!RVar2 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[124]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x310,ERROR,
               "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\""
               ,(char (*) [124])
                "failed: expected lists.get(\"list1\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<bool>()"
              );
  }
  name_13.content.size_ = 6;
  name_13.content.ptr = "list1";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_13);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_14.content.size_ = 2;
  name_14.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_14);
  RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if (RVar2 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[127]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x311,ERROR,
               "\"failed: expected \" \"!(lists.get(\\\"list1\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>())\""
               ,(char (*) [127])
                "failed: expected !(lists.get(\"list1\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<bool>())"
              );
  }
  name_15.content.size_ = 6;
  name_15.content.ptr = "list1";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_15);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,2);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_16.content.size_ = 2;
  name_16.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_16);
  RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if (!RVar2 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[124]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x312,ERROR,
               "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\""
               ,(char (*) [124])
                "failed: expected lists.get(\"list1\").template as<DynamicList>()[2].template as<DynamicStruct>().get(\"f\").template as<bool>()"
              );
  }
  name_17.content.size_ = 6;
  name_17.content.ptr = "list1";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_17);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,3);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_18.content.size_ = 2;
  name_18.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_18);
  RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if (!RVar2 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[124]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x313,ERROR,
               "\"failed: expected \" \"lists.get(\\\"list1\\\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\\\"f\\\").template as<bool>()\""
               ,(char (*) [124])
                "failed: expected lists.get(\"list1\").template as<DynamicList>()[3].template as<DynamicStruct>().get(\"f\").template as<bool>()"
              );
  }
  name_19.content.size_ = 6;
  name_19.content.ptr = "list8";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_19);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_20.content.size_ = 2;
  name_20.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_20);
  uVar3 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar3 != '{') && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr._0_4_ = 0x7b;
    name_21.content.size_ = 6;
    name_21.content.ptr = "list8";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_21);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_22.content.size_ = 2;
    name_22.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_22);
    uVar3 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)local_388);
    local_220 = CONCAT71(local_220._1_7_,uVar3);
    kj::_::Debug::log<char_const(&)[139],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x314,ERROR,
               "\"failed: expected \" \"(123u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", 123u, lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
               ,(char (*) [139])
                "failed: expected (123u) == (lists.get(\"list8\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
               ,(uint *)&local_268,(uchar *)&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_23.content.size_ = 6;
  name_23.content.ptr = "list8";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_23);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_24.content.size_ = 2;
  name_24.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_24);
  uVar3 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar3 != '-') && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr._0_4_ = 0x2d;
    name_25.content.size_ = 6;
    name_25.content.ptr = "list8";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_25);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_26.content.size_ = 2;
    name_26.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_26);
    uVar3 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)local_388);
    local_220 = CONCAT71(local_220._1_7_,uVar3);
    kj::_::Debug::log<char_const(&)[138],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x315,ERROR,
               "\"failed: expected \" \"(45u) == (lists.get(\\\"list8\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint8_t>())\", 45u, lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>()"
               ,(char (*) [138])
                "failed: expected (45u) == (lists.get(\"list8\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint8_t>())"
               ,(uint *)&local_268,(uchar *)&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_27.content.size_ = 7;
  name_27.content.ptr = "list16";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_27);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_28.content.size_ = 2;
  name_28.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_28);
  uVar4 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar4 != 0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr._0_4_ = 0x3039;
    name_29.content.size_ = 7;
    name_29.content.ptr = "list16";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_29);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_30.content.size_ = 2;
    name_30.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_30);
    uVar4 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)local_388)
    ;
    local_220 = CONCAT62(local_220._2_6_,uVar4);
    kj::_::Debug::log<char_const(&)[143],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x316,ERROR,
               "\"failed: expected \" \"(12345u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", 12345u, lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
               ,(char (*) [143])
                "failed: expected (12345u) == (lists.get(\"list16\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
               ,(uint *)&local_268,(unsigned_short *)&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_31.content.size_ = 7;
  name_31.content.ptr = "list16";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_31);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_32.content.size_ = 2;
  name_32.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_32);
  uVar4 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar4 != 0x1a85) && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr._0_4_ = 0x1a85;
    name_33.content.size_ = 7;
    name_33.content.ptr = "list16";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_33);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_34.content.size_ = 2;
    name_34.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_34);
    uVar4 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)local_388)
    ;
    local_220 = CONCAT62(local_220._2_6_,uVar4);
    kj::_::Debug::log<char_const(&)[142],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x317,ERROR,
               "\"failed: expected \" \"(6789u) == (lists.get(\\\"list16\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint16_t>())\", 6789u, lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>()"
               ,(char (*) [142])
                "failed: expected (6789u) == (lists.get(\"list16\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint16_t>())"
               ,(uint *)&local_268,(unsigned_short *)&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_35.content.size_ = 7;
  name_35.content.ptr = "list32";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_35);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_36.content.size_ = 2;
  name_36.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_36);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar5 != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr._0_4_ = 0x75bcd15;
    name_37.content.size_ = 7;
    name_37.content.ptr = "list32";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_37);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_38.content.size_ = 2;
    name_38.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_38);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_388);
    local_220 = CONCAT44(local_220._4_4_,uVar5);
    kj::_::Debug::log<char_const(&)[147],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x318,ERROR,
               "\"failed: expected \" \"(123456789u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", 123456789u, lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
               ,(char (*) [147])
                "failed: expected (123456789u) == (lists.get(\"list32\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
               ,(uint *)&local_268,(uint *)&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_39.content.size_ = 7;
  name_39.content.ptr = "list32";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_39);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_40.content.size_ = 2;
  name_40.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_40);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar5 != 0xdfb38d2) && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr._0_4_ = 0xdfb38d2;
    name_41.content.size_ = 7;
    name_41.content.ptr = "list32";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_41);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_42.content.size_ = 2;
    name_42.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_42);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_388);
    local_220 = CONCAT44(local_220._4_4_,uVar5);
    kj::_::Debug::log<char_const(&)[147],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x319,ERROR,
               "\"failed: expected \" \"(234567890u) == (lists.get(\\\"list32\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint32_t>())\", 234567890u, lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>()"
               ,(char (*) [147])
                "failed: expected (234567890u) == (lists.get(\"list32\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint32_t>())"
               ,(uint *)&local_268,(uint *)&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_43.content.size_ = 7;
  name_43.content.ptr = "list64";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_43);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_44.content.size_ = 2;
  name_44.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_44);
  uVar7 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar7 != 0x462d53c8abac0) && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr = (char *)0x462d53c8abac0;
    name_45.content.size_ = 7;
    name_45.content.ptr = "list64";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_45);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_46.content.size_ = 2;
    name_46.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_46);
    local_220 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                          ((Reader *)local_388);
    kj::_::Debug::log<char_const(&)[154],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31a,ERROR,
               "\"failed: expected \" \"(1234567890123456u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", 1234567890123456u, lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
               ,(char (*) [154])
                "failed: expected (1234567890123456u) == (lists.get(\"list64\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
               ,(unsigned_long *)&local_268,&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_47.content.size_ = 7;
  name_47.content.ptr = "list64";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_47);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_48.content.size_ = 2;
  name_48.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_48);
  uVar7 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((uVar7 != 0x85561edaa4b87) && (kj::_::Debug::minSeverity < 3)) {
    local_268.ptr = (char *)0x85561edaa4b87;
    name_49.content.size_ = 7;
    name_49.content.ptr = "list64";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_49);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_50.content.size_ = 2;
    name_50.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_50);
    local_220 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                          ((Reader *)local_388);
    kj::_::Debug::log<char_const(&)[154],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31b,ERROR,
               "\"failed: expected \" \"(2345678901234567u) == (lists.get(\\\"list64\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<uint64_t>())\", 2345678901234567u, lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>()"
               ,(char (*) [154])
                "failed: expected (2345678901234567u) == (lists.get(\"list64\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<uint64_t>())"
               ,(unsigned_long *)&local_268,&local_220);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_51.content.size_ = 6;
  name_51.content.ptr = "listP";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_51);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_52.content.size_ = 2;
  name_52.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_52);
  RVar11 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)local_388);
  bVar10 = true;
  if (RVar11.super_StringPtr.content.size_ == 4) {
    bVar10 = (char)RVar11.super_StringPtr.content.ptr[1] != 'o' ||
             *RVar11.super_StringPtr.content.ptr != 0x6f66;
  }
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((bool)(bVar10 & kj::_::Debug::minSeverity < 3)) {
    name_53.content.size_ = 6;
    name_53.content.ptr = "listP";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_53);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_54.content.size_ = 2;
    name_54.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_54);
    local_268 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)local_388);
    kj::_::Debug::log<char_const(&)[137],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31c,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", \"foo\", lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>()"
               ,(char (*) [137])
                "failed: expected (\"foo\") == (lists.get(\"listP\").template as<DynamicList>()[0].template as<DynamicStruct>().get(\"f\").template as<Text>())"
               ,(char (*) [4])"foo",(Reader *)&local_268);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_55.content.size_ = 6;
  name_55.content.ptr = "listP";
  DynamicStruct::Reader::get(&local_2f8,&local_218,name_55);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
  DynamicList::Reader::operator[](&local_340,&local_2a8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340);
  name_56.content.size_ = 2;
  name_56.content.ptr = "f";
  DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_56);
  RVar11 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)local_388);
  bVar10 = true;
  if (RVar11.super_StringPtr.content.size_ == 4) {
    bVar10 = (char)RVar11.super_StringPtr.content.ptr[1] != 'r' ||
             *RVar11.super_StringPtr.content.ptr != 0x6162;
  }
  DynamicValue::Reader::~Reader((Reader *)local_388);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicValue::Reader::~Reader(&local_2f8);
  if ((bool)(bVar10 & kj::_::Debug::minSeverity < 3)) {
    name_57.content.size_ = 6;
    name_57.content.ptr = "listP";
    DynamicStruct::Reader::get(&local_2f8,&local_218,name_57);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_2a8,&local_2f8);
    DynamicList::Reader::operator[](&local_340,&local_2a8,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_258,&local_340)
    ;
    name_58.content.size_ = 2;
    name_58.content.ptr = "f";
    DynamicStruct::Reader::get((Reader *)local_388,&local_258,name_58);
    local_268 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)local_388);
    kj::_::Debug::log<char_const(&)[137],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x31d,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (lists.get(\\\"listP\\\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\\\"f\\\").template as<Text>())\", \"bar\", lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>()"
               ,(char (*) [137])
                "failed: expected (\"bar\") == (lists.get(\"listP\").template as<DynamicList>()[1].template as<DynamicStruct>().get(\"f\").template as<Text>())"
               ,(char (*) [4])0x2b772e,(Reader *)&local_268);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    DynamicValue::Reader::~Reader(&local_340);
    DynamicValue::Reader::~Reader(&local_2f8);
  }
  name_59.content.size_ = 0xe;
  name_59.content.ptr = "int32ListList";
  sVar8 = 0xe;
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_59);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (local_340.field_1._32_4_ != 3) {
    local_2f8.type = INT;
    local_2a8.schema.elementType.baseType = local_340.field_1._32_2_;
    local_2a8.schema.elementType.listDepth = local_340.field_1.field12[0x22];
    local_2a8.schema.elementType.isImplicitParam = local_340.field_1._35_1_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x321,FAILED,"(3u) == (l.size())","3u, l.size()",&local_2f8.type,(uint *)&local_2a8)
    ;
    kj::_::Debug::Fault::fatal((Fault *)local_388);
  }
  DynamicList::Reader::operator[](&local_78,(Reader *)&local_340,0);
  local_388._0_8_ = (Exception *)0x200000001;
  local_388._8_4_ = 3;
  expected._M_len = sVar8;
  expected._M_array = (iterator)0x3;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_78,(Reader *)local_388,expected);
  DynamicValue::Reader::~Reader(&local_78);
  DynamicList::Reader::operator[](&local_c0,(Reader *)&local_340,1);
  local_388._0_8_ = (Exception *)0x500000004;
  expected_00._M_len = sVar8;
  expected_00._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_c0,(Reader *)local_388,expected_00);
  DynamicValue::Reader::~Reader(&local_c0);
  DynamicList::Reader::operator[](&local_108,(Reader *)&local_340,2);
  local_388._0_4_ = 0xbc4ff2;
  expected_01._M_len = sVar8;
  expected_01._M_array = (iterator)0x1;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_108,(Reader *)local_388,expected_01);
  DynamicValue::Reader::~Reader(&local_108);
  name_60.content.size_ = 0xd;
  name_60.content.ptr = "textListList";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_60);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (local_340.field_1._32_4_ != 3) {
    local_2f8.type = INT;
    local_2a8.schema.elementType.baseType = local_340.field_1._32_2_;
    local_2a8.schema.elementType.listDepth = local_340.field_1.field12[0x22];
    local_2a8.schema.elementType.isImplicitParam = local_340.field_1._35_1_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x329,FAILED,"(3u) == (l.size())","3u, l.size()",&local_2f8.type,(uint *)&local_2a8)
    ;
    kj::_::Debug::Fault::fatal((Fault *)local_388);
  }
  DynamicList::Reader::operator[](&local_150,(Reader *)&local_340,0);
  local_388._0_8_ = "foo";
  local_388._8_8_ = 4;
  local_388._16_8_ = "bar";
  local_388._24_8_ = (SegmentReader *)0x4;
  expected_02._M_len = (size_type)"bar";
  expected_02._M_array = (iterator)0x2;
  pcVar9 = "bar";
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_150,(Reader *)local_388,expected_02);
  DynamicValue::Reader::~Reader(&local_150);
  DynamicList::Reader::operator[](&local_198,(Reader *)&local_340,1);
  local_388._0_8_ = "baz";
  local_388._8_8_ = 4;
  expected_03._M_len = (size_type)pcVar9;
  expected_03._M_array = (iterator)0x1;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_198,(Reader *)local_388,expected_03);
  DynamicValue::Reader::~Reader(&local_198);
  DynamicList::Reader::operator[](&local_1e0,(Reader *)&local_340,2);
  local_388._0_8_ = "qux";
  local_388._8_8_ = 4;
  local_388._16_8_ = "corge";
  local_388._24_8_ = (SegmentReader *)0x6;
  expected_04._M_len = (size_type)pcVar9;
  expected_04._M_array = (iterator)0x2;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_1e0,(Reader *)local_388,expected_04);
  DynamicValue::Reader::~Reader(&local_1e0);
  name_61.content.size_ = 0xf;
  name_61.content.ptr = "structListList";
  DynamicStruct::Reader::get((Reader *)local_388,&local_218,name_61);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_340,(Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (local_340.field_1._32_4_ != 2) {
    local_2f8.type = BOOL;
    local_2a8.schema.elementType.baseType = local_340.field_1._32_2_;
    local_2a8.schema.elementType.listDepth = local_340.field_1.field12[0x22];
    local_2a8.schema.elementType.isImplicitParam = local_340.field_1._35_1_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x331,FAILED,"(2u) == (l.size())","2u, l.size()",&local_2f8.type,(uint *)&local_2a8)
    ;
    kj::_::Debug::Fault::fatal((Fault *)local_388);
  }
  DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_340,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_2f8,(Reader *)local_388);
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (local_2f8.field_1._32_4_ != 2) {
    local_2a8.schema.elementType.baseType = INT8;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    local_258.schema.super_Schema.raw._0_4_ = local_2f8.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x333,FAILED,"(2u) == (e.size())","2u, e.size()",(uint *)&local_2a8,
               (uint *)&local_258);
    kj::_::Debug::Fault::fatal((Fault *)local_388);
  }
  DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_2f8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_2a8,(Reader *)local_388);
  Schema::requireUsableAs((Schema *)&local_2a8,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  if (local_2a8.reader.elementCount < 0x40) {
    DynamicValue::Reader::~Reader((Reader *)local_388);
LAB_00248403:
    if (kj::_::Debug::minSeverity < 3) {
      local_258.schema.super_Schema.raw._0_4_ = 0x7b;
      DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_2f8,0);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&local_2a8,(Reader *)local_388);
      Schema::requireUsableAs((Schema *)&local_2a8,(RawSchema *)schemas::s_a0a8f314b80b63fd);
      uVar6 = 0;
      if (0x3f < local_2a8.reader.elementCount) {
        uVar6 = *(undefined4 *)((long)&(local_2a8.reader.capTable)->_vptr_CapTableReader + 4);
      }
      local_268.ptr._0_4_ = uVar6;
      kj::_::Debug::log<char_const(&)[77],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x334,ERROR,
                 "\"failed: expected \" \"(123) == (e[0].template as<TestAllTypes>().getInt32Field())\", 123, e[0].template as<TestAllTypes>().getInt32Field()"
                 ,(char (*) [77])
                  "failed: expected (123) == (e[0].template as<TestAllTypes>().getInt32Field())",
                 (int *)&local_258,(int *)&local_268);
      DynamicValue::Reader::~Reader((Reader *)local_388);
    }
  }
  else {
    iVar1 = *(int *)((long)&(local_2a8.reader.capTable)->_vptr_CapTableReader + 4);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    if (iVar1 != 0x7b) goto LAB_00248403;
  }
  DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_2f8,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_2a8,(Reader *)local_388);
  Schema::requireUsableAs((Schema *)&local_2a8,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  if (local_2a8.reader.elementCount < 0x40) {
    DynamicValue::Reader::~Reader((Reader *)local_388);
  }
  else {
    iVar1 = *(int *)((long)&(local_2a8.reader.capTable)->_vptr_CapTableReader + 4);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    if (iVar1 == 0x1c8) goto LAB_002485d3;
  }
  if (kj::_::Debug::minSeverity < 3) {
    local_258.schema.super_Schema.raw._0_4_ = 0x1c8;
    DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_2f8,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_2a8,(Reader *)local_388);
    Schema::requireUsableAs((Schema *)&local_2a8,(RawSchema *)schemas::s_a0a8f314b80b63fd);
    uVar6 = 0;
    if (0x3f < local_2a8.reader.elementCount) {
      uVar6 = *(undefined4 *)((long)&(local_2a8.reader.capTable)->_vptr_CapTableReader + 4);
    }
    local_268.ptr._0_4_ = uVar6;
    kj::_::Debug::log<char_const(&)[77],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x335,ERROR,
               "\"failed: expected \" \"(456) == (e[1].template as<TestAllTypes>().getInt32Field())\", 456, e[1].template as<TestAllTypes>().getInt32Field()"
               ,(char (*) [77])
                "failed: expected (456) == (e[1].template as<TestAllTypes>().getInt32Field())",
               (int *)&local_258,(int *)&local_268);
    DynamicValue::Reader::~Reader((Reader *)local_388);
  }
LAB_002485d3:
  DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_340,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_2a8,(Reader *)local_388);
  local_2f8.field_1._32_4_ = local_2a8.reader.elementCount;
  local_2f8.field_1.listValue.reader.elementCount = local_2a8.reader.structDataSize;
  local_2f8.field_1.structValue.reader.pointerCount = local_2a8.reader.structPointerCount;
  local_2f8.field_1.field12[0x2e] = local_2a8.reader.elementSize;
  local_2f8.field_1.field12[0x2f] = local_2a8.reader._39_1_;
  local_2f8.field_1._48_8_ = local_2a8.reader._40_8_;
  local_2f8.field_1.listValue.reader.capTable = (CapTableReader *)local_2a8.reader.ptr;
  local_2f8.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_2a8.reader.segment;
  local_2f8.field_1.listValue.reader.segment = (SegmentReader *)local_2a8.reader.capTable;
  local_2f8.field_1.uintValue = local_2a8.schema.elementType.field_4.scopeId;
  DynamicValue::Reader::~Reader((Reader *)local_388);
  if (local_2f8.field_1._32_4_ != 1) {
    local_2a8.schema.elementType.baseType = BOOL;
    local_2a8.schema.elementType.listDepth = '\0';
    local_2a8.schema.elementType.isImplicitParam = false;
    local_258.schema.super_Schema.raw._0_4_ = local_2f8.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x337,FAILED,"(1u) == (e.size())","1u, e.size()",(uint *)&local_2a8,
               (uint *)&local_258);
    kj::_::Debug::Fault::fatal((Fault *)local_388);
  }
  DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_2f8,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_2a8,(Reader *)local_388);
  Schema::requireUsableAs((Schema *)&local_2a8,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  if (local_2a8.reader.elementCount < 0x40) {
    DynamicValue::Reader::~Reader((Reader *)local_388);
  }
  else {
    iVar1 = *(int *)((long)&(local_2a8.reader.capTable)->_vptr_CapTableReader + 4);
    DynamicValue::Reader::~Reader((Reader *)local_388);
    if (iVar1 == 0x315) {
      return;
    }
  }
  if (kj::_::Debug::minSeverity < 3) {
    local_258.schema.super_Schema.raw._0_4_ = 0x315;
    DynamicList::Reader::operator[]((Reader *)local_388,(Reader *)&local_2f8,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_2a8,(Reader *)local_388);
    Schema::requireUsableAs((Schema *)&local_2a8,(RawSchema *)schemas::s_a0a8f314b80b63fd);
    uVar6 = 0;
    if (0x3f < local_2a8.reader.elementCount) {
      uVar6 = *(undefined4 *)((long)&(local_2a8.reader.capTable)->_vptr_CapTableReader + 4);
    }
    local_268.ptr._0_4_ = uVar6;
    kj::_::Debug::log<char_const(&)[77],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x338,ERROR,
               "\"failed: expected \" \"(789) == (e[0].template as<TestAllTypes>().getInt32Field())\", 789, e[0].template as<TestAllTypes>().getInt32Field()"
               ,(char (*) [77])
                "failed: expected (789) == (e[0].template as<TestAllTypes>().getInt32Field())",
               (int *)&local_258,(int *)&local_268);
    DynamicValue::Reader::~Reader((Reader *)local_388);
  }
  return;
}

Assistant:

void dynamicCheckListDefaults(Reader reader) {
  auto lists = reader.get("lists").as<DynamicStruct>();

  ASSERT_EQ(2u, lists.get("list0").as<DynamicList>().size());
  ASSERT_EQ(4u, lists.get("list1").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list8").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list16").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list32").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("list64").as<DynamicList>().size());
  ASSERT_EQ(2u, lists.get("listP").as<DynamicList>().size());

  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_EQ(VOID, lists.get("list0").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Void>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_FALSE(lists.get("list1").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[2].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_TRUE(lists.get("list1").as<DynamicList>()[3].as<DynamicStruct>().get("f").as<bool>());
  EXPECT_EQ(123u, lists.get("list8").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(45u, lists.get("list8").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint8_t>());
  EXPECT_EQ(12345u, lists.get("list16").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(6789u, lists.get("list16").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint16_t>());
  EXPECT_EQ(123456789u, lists.get("list32").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(234567890u, lists.get("list32").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint32_t>());
  EXPECT_EQ(1234567890123456u, lists.get("list64").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ(2345678901234567u, lists.get("list64").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<uint64_t>());
  EXPECT_EQ("foo", lists.get("listP").as<DynamicList>()[0].as<DynamicStruct>().get("f").as<Text>());
  EXPECT_EQ("bar", lists.get("listP").as<DynamicList>()[1].as<DynamicStruct>().get("f").as<Text>());

  {
    auto l = lists.get("int32ListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<int32_t>(l[0], {1, 2, 3});
    checkList<int32_t>(l[1], {4, 5});
    checkList<int32_t>(l[2], {12341234});
  }

  {
    auto l = lists.get("textListList").as<DynamicList>();
    ASSERT_EQ(3u, l.size());
    checkList<Text>(l[0], {"foo", "bar"});
    checkList<Text>(l[1], {"baz"});
    checkList<Text>(l[2], {"qux", "corge"});
  }

  {
    auto l = lists.get("structListList").as<DynamicList>();
    ASSERT_EQ(2u, l.size());
    auto e = l[0].as<DynamicList>();
    ASSERT_EQ(2u, e.size());
    EXPECT_EQ(123, e[0].as<TestAllTypes>().getInt32Field());
    EXPECT_EQ(456, e[1].as<TestAllTypes>().getInt32Field());
    e = l[1].as<DynamicList>();
    ASSERT_EQ(1u, e.size());
    EXPECT_EQ(789, e[0].as<TestAllTypes>().getInt32Field());
  }
}